

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_main.cpp
# Opt level: O0

void printHelp(BenchFuction test)

{
  BenchFuction test_local;
  
  if (test == bench_none) {
    std::operator<<((ostream *)&std::cout,"\nusage: ./benchmark <function> <parameters>\n\n");
    std::operator<<((ostream *)&std::cout,
                    "functions: makegrid, loadneeded, evaluate(-mixed), differentiate, iweights, refine\n"
                   );
    std::operator<<((ostream *)&std::cout,"\n see: ./benchmark <function> help\n");
  }
  else if (test == bench_make) {
    std::operator<<((ostream *)&std::cout,
                    "\nusage: ./benchmark makegrid <grid> <dims> <depth> <type> <rule> <iters> <jumps> <aniso>\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n");
    std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
    std::operator<<((ostream *)&std::cout,"depth : grid density\n");
    std::operator<<((ostream *)&std::cout,
                    "type  : level, iptotal, etc.; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n")
    ;
    std::operator<<((ostream *)&std::cout,"iters : number of times to repeat the function call\n");
    std::operator<<((ostream *)&std::cout,"jumps : how many times to increment <depth> by 1\n");
    std::operator<<((ostream *)&std::cout,
                    "aniso : (optional) list of anisotropic weights and level limits\n");
    std::operator<<((ostream *)&std::cout,
                    "      : anisotropic weights come first (if used by the grid), then level limits\n"
                   );
  }
  else if (test == bench_loadneeded) {
    std::operator<<((ostream *)&std::cout,
                    "\nusage: ./benchmark loadneeded <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps> <acc> <gpu> <extra>\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n");
    std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
    std::operator<<((ostream *)&std::cout,"outs  : number of outputs\n");
    std::operator<<((ostream *)&std::cout,"depth : grid density\n");
    std::operator<<((ostream *)&std::cout,
                    "type  : level, iptotal, etc.; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n")
    ;
    std::operator<<((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,"iters : number of times to repeat the function call\n");
    std::operator<<((ostream *)&std::cout,"jumps : how many times to double <outs>\n");
    std::operator<<((ostream *)&std::cout,
                    "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n");
    std::operator<<((ostream *)&std::cout,"gpu   : cuda device ID; ignored for cpu acceleration\n");
    std::operator<<((ostream *)&std::cout,
                    "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "      : anisotropic weights come first (if used by the grid), then level limits\n"
                   );
  }
  else if ((test == bench_evaluate) || (test == bench_evaluate_mixed)) {
    std::operator<<((ostream *)&std::cout,
                    "\nusage: ./benchmark evaluate <grid> <dims> <outs> <depth> <type> <rule> <order> <batch> <iters> <jumps> <acc> <gpu> <extra>\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n");
    std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
    std::operator<<((ostream *)&std::cout,"outs  : number of outputs\n");
    std::operator<<((ostream *)&std::cout,"depth : grid density\n");
    std::operator<<((ostream *)&std::cout,
                    "type  : level, iptotal, etc.; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n")
    ;
    std::operator<<((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "batch : number of points to use for the evaluate command\n");
    std::operator<<((ostream *)&std::cout,"iters : number of times to repeat the function call\n");
    std::operator<<((ostream *)&std::cout,"jumps : how many times to double <outs>\n");
    std::operator<<((ostream *)&std::cout,
                    "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n");
    std::operator<<((ostream *)&std::cout,"gpu   : cuda device ID; ignored for cpu acceleration\n");
    std::operator<<((ostream *)&std::cout,
                    "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "      : anisotropic weights come first (if used by the grid), then level limits\n"
                   );
  }
  else if (test == bench_differentiate) {
    std::operator<<((ostream *)&std::cout,
                    "\nusage: ./benchmark differentiate <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps>\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n");
    std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
    std::operator<<((ostream *)&std::cout,"outs  : number of outputs\n");
    std::operator<<((ostream *)&std::cout,"depth : grid density\n");
    std::operator<<((ostream *)&std::cout,
                    "type  : level, iptotal, etc.; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n")
    ;
    std::operator<<((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,"iters : number of times to repeat the function call\n");
    std::operator<<((ostream *)&std::cout,"jumps : how many times to double <outs>\n");
    std::operator<<((ostream *)&std::cout,
                    "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "      : anisotropic weights come first (if used by the grid), then level limits\n"
                   );
  }
  else if (test == bench_iweights) {
    std::operator<<((ostream *)&std::cout,
                    "\nusage: ./benchmark iweights <grid> <dims> <depth> <type> <rule> <order> <iters> <jumps> <aniso>\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n");
    std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
    std::operator<<((ostream *)&std::cout,"depth : grid density\n");
    std::operator<<((ostream *)&std::cout,
                    "type  : level, iptotal, etc.; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and Fourier grids\n")
    ;
    std::operator<<((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,"iters : number of times to repeat the function call\n");
    std::operator<<((ostream *)&std::cout,"jumps : how many times to increase <depth> by 1\n");
    std::operator<<((ostream *)&std::cout,
                    "aniso : (optional) list of anisotropic weights and level limits\n");
    std::operator<<((ostream *)&std::cout,
                    "      : anisotropic weights come first (if used by the grid), then level limits\n"
                   );
  }
  else if (test == bench_refine) {
    std::operator<<((ostream *)&std::cout,
                    "\nusage: ./benchmark refine <grid> <dims> <outs> <depth> <type> <rule> <order> <ref-type-depth> <min-growth> <surp-tolerance> <surp-criteria> <output> <iters> <acc> <gpu> <extra>\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n");
    std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
    std::operator<<((ostream *)&std::cout,"outs  : number of outputs\n");
    std::operator<<((ostream *)&std::cout,"depth : grid density\n");
    std::operator<<((ostream *)&std::cout,
                    "type  : level, iptotal, etc.; ignored if not used by the grid\n");
    std::operator<<((ostream *)&std::cout,
                    "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n")
    ;
    std::operator<<((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "ref-type-depth : (anisotropic refinement) refinement type, e.g., iptotal, ipcurved\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "min-growth     : (anisotropic refinement) minumum number of refinement points, use 0 to switch to surplus refinement\n"
                   );
    std::operator<<((ostream *)&std::cout,"surp-tolerance : (surplus refinement) tolerance\n");
    std::operator<<((ostream *)&std::cout,
                    "surp-criteria  : (surplus refinement) selection criteria, e.g., stable, fds\n")
    ;
    std::operator<<((ostream *)&std::cout,
                    "output         : (all refinement) output to use in the refinement\n\n");
    std::operator<<((ostream *)&std::cout,"iters : number of times to repeat the function call\n");
    std::operator<<((ostream *)&std::cout,
                    "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n");
    std::operator<<((ostream *)&std::cout,"gpu   : cuda device ID; ignored for cpu acceleration\n");
    std::operator<<((ostream *)&std::cout,
                    "extra : (optional) list of anisotropic weights and level limits\n");
    std::operator<<((ostream *)&std::cout,
                    "      : anisotropic weights come first (if used by the grid), then level limits\n"
                   );
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printHelp(BenchFuction test){
    if (test == bench_none){
        cout << "\nusage: ./benchmark <function> <parameters>\n\n";
        cout << "functions: makegrid, loadneeded, evaluate(-mixed), differentiate, iweights, refine\n";
        cout << "\n see: ./benchmark <function> help\n";
    }else if (test == bench_make){
        cout << "\nusage: ./benchmark makegrid <grid> <dims> <depth> <type> <rule> <iters> <jumps> <aniso>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to increment <depth> by 1\n";
        cout << "aniso : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_loadneeded){
        cout << "\nusage: ./benchmark loadneeded <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_evaluate || test == bench_evaluate_mixed){
        cout << "\nusage: ./benchmark evaluate <grid> <dims> <outs> <depth> <type> <rule> <order> <batch> <iters> <jumps> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "batch : number of points to use for the evaluate command\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_differentiate){
        cout << "\nusage: ./benchmark differentiate <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_iweights){
        cout << "\nusage: ./benchmark iweights <grid> <dims> <depth> <type> <rule> <order> <iters> <jumps> <aniso>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and Fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to increase <depth> by 1\n";
        cout << "aniso : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_refine){
        cout << "\nusage: ./benchmark refine <grid> <dims> <outs> <depth> <type> <rule> <order> <ref-type-depth> <min-growth> <surp-tolerance> <surp-criteria> <output> <iters> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n\n";

        cout << "ref-type-depth : (anisotropic refinement) refinement type, e.g., iptotal, ipcurved\n";
        cout << "min-growth     : (anisotropic refinement) minumum number of refinement points, use 0 to switch to surplus refinement\n";
        cout << "surp-tolerance : (surplus refinement) tolerance\n";
        cout << "surp-criteria  : (surplus refinement) selection criteria, e.g., stable, fds\n";
        cout << "output         : (all refinement) output to use in the refinement\n\n";

        cout << "iters : number of times to repeat the function call\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }
    cout << endl;
}